

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

void __thiscall
google::FlagRegisterer::FlagRegisterer
          (FlagRegisterer *this,char *name,char *type,char *help,char *filename,
          void *current_storage,void *defvalue_storage)

{
  char *pcVar1;
  FlagValue *this_00;
  FlagValue *this_01;
  CommandLineFlag *this_02;
  FlagRegistry *this_03;
  CommandLineFlag *flag;
  FlagValue *defvalue;
  FlagValue *current;
  void *current_storage_local;
  char *filename_local;
  char *help_local;
  char *type_local;
  char *name_local;
  FlagRegisterer *this_local;
  
  filename_local = help;
  if (help == (char *)0x0) {
    filename_local = "";
  }
  pcVar1 = strchr(type,0x3a);
  help_local = type;
  if (pcVar1 != (char *)0x0) {
    pcVar1 = strrchr(type,0x3a);
    help_local = pcVar1 + 1;
  }
  this_00 = (FlagValue *)operator_new(0x10);
  anon_unknown_1::FlagValue::FlagValue(this_00,current_storage,help_local,false);
  this_01 = (FlagValue *)operator_new(0x10);
  anon_unknown_1::FlagValue::FlagValue(this_01,defvalue_storage,help_local,false);
  this_02 = (CommandLineFlag *)operator_new(0x38);
  anon_unknown_1::CommandLineFlag::CommandLineFlag
            (this_02,name,filename_local,filename,this_00,this_01);
  this_03 = anon_unknown_1::FlagRegistry::GlobalRegistry();
  anon_unknown_1::FlagRegistry::RegisterFlag(this_03,this_02);
  return;
}

Assistant:

FlagRegisterer::FlagRegisterer(const char* name, const char* type,
                               const char* help, const char* filename,
                               void* current_storage, void* defvalue_storage) {
  if (help == NULL)
    help = "";
  // FlagValue expects the type-name to not include any namespace
  // components, so we get rid of those, if any.
  if (strchr(type, ':'))
    type = strrchr(type, ':') + 1;
  FlagValue* current = new FlagValue(current_storage, type, false);
  FlagValue* defvalue = new FlagValue(defvalue_storage, type, false);
  // Importantly, flag_ will never be deleted, so storage is always good.
  CommandLineFlag* flag = new CommandLineFlag(name, help, filename,
                                              current, defvalue);
  FlagRegistry::GlobalRegistry()->RegisterFlag(flag);   // default registry
}